

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *
Kernel::operator*(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
                 Numeral *n,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *self)

{
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> SStack_58;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:609:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_38;
  
  local_38._iter._inner._inner._to =
       ((long)(self->_summands)._cursor - (long)(self->_summands)._stack >> 4) * -0x5555555555555555
  ;
  local_38._iter._inner._inner._next = 0;
  local_38._iter._inner._inner._from = 0;
  local_38._iter._func.n = n;
  local_38._iter._inner._func.a = &self->_summands;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Polynomial.hpp:609:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(&SStack_58,&local_38);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom(__return_storage_ptr__,&SStack_58);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&SStack_58);
  return __return_storage_ptr__;
}

Assistant:

Polynom operator*(Numeral n, Polynom const& self) 
  { return Polynom(self.iterSummands()
      .map([&](auto m) { return n * m; })
      .template collect<Stack>()); }